

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<char_data_*const_&,_char_data_*const_&>::streamReconstructedExpression
          (BinaryExpr<char_data_*const_&,_char_data_*const_&> *this,ostream *os)

{
  StringRef SVar1;
  char_data **in_RDX;
  char_data **e;
  string local_60;
  string local_40;
  
  Detail::stringify<char_data*>(&local_40,(Detail *)this->m_lhs,in_RDX);
  SVar1 = this->m_op;
  Detail::stringify<char_data*>(&local_60,(Detail *)this->m_rhs,e);
  Catch::formatReconstructedExpression(os,(string *)&local_40,SVar1,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }